

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O0

bool __thiscall
cmSourceFileLocation::MatchesAmbiguousExtension
          (cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  string_view str;
  __type _Var1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  cmake *this_00;
  string_view prefix;
  undefined1 auVar7 [16];
  cmake *cm;
  cmMakefile *mf;
  char *local_58;
  undefined1 local_50 [8];
  basic_string_view<char,_std::char_traits<char>_> ext;
  cmSourceFileLocation *loc_local;
  cmSourceFileLocation *this_local;
  
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSourceFileLocation.cxx"
                  ,0x8b,
                  "bool cmSourceFileLocation::MatchesAmbiguousExtension(const cmSourceFileLocation &) const"
                 );
  }
  _Var1 = std::operator==(&this->Name,&loc->Name);
  if (_Var1) {
    this_local._7_1_ = true;
  }
  else {
    uVar3 = std::__cxx11::string::size();
    uVar4 = std::__cxx11::string::size();
    if (uVar4 < uVar3) {
      std::__cxx11::string::size();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->Name);
      if (*pcVar5 == '.') {
        str = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->Name);
        prefix = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&loc->Name);
        ext._M_str = (char *)prefix._M_len;
        bVar2 = cmHasPrefix(str,prefix);
        if (bVar2) {
          auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->Name);
          local_58 = auVar7._8_8_;
          mf = auVar7._0_8_;
          lVar6 = std::__cxx11::string::size();
          _local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                ((basic_string_view<char,_std::char_traits<char>_> *)&mf,lVar6 + 1,
                                 0xffffffffffffffff);
          this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
          bVar2 = cmake::IsAKnownExtension(this_00,_local_50);
          return bVar2;
        }
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmSourceFileLocation::MatchesAmbiguousExtension(
  cmSourceFileLocation const& loc) const
{
  assert(this->Makefile);
  // This location's extension is not ambiguous but loc's extension
  // is.  See if the names match as-is.
  if (this->Name == loc.Name) {
    return true;
  }

  // Check if loc's name could possibly be extended to our name by
  // adding an extension.
  if (!(this->Name.size() > loc.Name.size() &&
        this->Name[loc.Name.size()] == '.' &&
        cmHasPrefix(this->Name, loc.Name))) {
    return false;
  }

  // Only a fixed set of extensions will be tried to match a file on
  // disk.  One of these must match if loc refers to this source file.
  auto ext = cm::string_view(this->Name).substr(loc.Name.size() + 1);
  cmMakefile const* mf = this->Makefile;
  auto* cm = mf->GetCMakeInstance();
  return cm->IsAKnownExtension(ext);
}